

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta,float objective_amplifier)

{
  int bkmin;
  row_iterator prVar1;
  default_cost_type<float> *this_00;
  undefined1 auVar2 [16];
  int r_size_00;
  float fVar3;
  bit_array *x_00;
  bool bVar4;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar5;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar6;
  type prVar7;
  pointer begin;
  pointer prVar8;
  type pbVar9;
  type prVar10;
  float fVar11;
  bool local_101;
  undefined1 auStack_b8 [7];
  bool pi_change;
  string_view local_a8;
  int local_94;
  undefined1 auStack_90 [4];
  int i_1;
  int local_7c;
  int local_78;
  int selected;
  int i;
  int r_size;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_54;
  undefined1 auStack_50 [4];
  int k;
  bool local_39;
  float local_38;
  float fStack_34;
  bool at_least_one_pi_changed;
  float objective_amplifier_local;
  float theta_local;
  float delta_local;
  float kappa_local;
  bit_array *x_local;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
  *this_local;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  last_local;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  first_local;
  
  local_39 = false;
  local_38 = objective_amplifier;
  fStack_34 = theta;
  objective_amplifier_local = delta;
  theta_local = kappa;
  _delta_local = x;
  x_local = (bit_array *)this;
  this_local = (solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                *)last._M_current;
  last_local = first;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_50,
             "push-update-row {} {} {}\n");
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,_auStack_50,&theta_local,&objective_amplifier_local,
             &stack0xffffffffffffffcc);
  while( true ) {
    bVar4 = __gnu_cxx::
            operator==<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      (&last_local,
                       (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)&this_local);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      return (bool)(local_39 & 1);
    }
    it.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (row_value *)last_local._M_current;
    local_54 = constraint<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                         (last_local);
    if (*(int *)(this + 0x78) <= local_54) break;
    sparse_matrix<int>::row((sparse_matrix<int> *)&i,(int)this + 0x10);
    pprVar5 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar1 = *pprVar5;
    pprVar6 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
    ::decrease_preference
              ((solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                *)this,prVar1,*pprVar6,fStack_34);
    pprVar5 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar1 = *pprVar5;
    pprVar6 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    selected = solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                           *)this,prVar1,*pprVar6,_delta_local);
    for (local_78 = 0; fVar3 = local_38, local_78 != selected; local_78 = local_78 + 1) {
      this_00 = *(default_cost_type<float> **)(this + 0x70);
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                             *)(this + 0x58),(long)local_78);
      fVar11 = default_cost_type<float>::operator()(this_00,prVar7->id,_delta_local);
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                             *)(this + 0x58),(long)local_78);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar3),
                               ZEXT416((uint)prVar7->value));
      prVar7->value = auVar2._0_4_;
    }
    begin = std::
            unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                   *)(this + 0x58));
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
             ::get((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                    *)(this + 0x58));
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>
              (begin,prVar8 + selected,*(random_engine **)(this + 8));
    r_size_00 = selected;
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                           *)(this + 0x60),(long)local_54);
    bkmin = pbVar9->min;
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                           *)(this + 0x60),(long)local_54);
    local_7c = solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
               ::select_variables((solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                                   *)this,r_size_00,bkmin,pbVar9->max);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_90,
               "constraints {}: {} <= ");
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                           *)(this + 0x60),(long)local_54);
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,_auStack_90,&local_54,&pbVar9->min);
    for (local_94 = 0; local_94 < selected; local_94 = local_94 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"({} {}) ")
      ;
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                             *)(this + 0x58),(long)local_94);
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                              *)(this + 0x58),(long)local_94);
      debug_logger<true>::log<float,int>
                ((debug_logger<true> *)this,local_a8,&prVar7->value,&prVar10->id);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b8,
               "<= {} => Selected: {}\n");
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                           *)(this + 0x60),(long)local_54);
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,_auStack_b8,&pbVar9->max,&local_7c);
    x_00 = _delta_local;
    pprVar5 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    bVar4 = affect<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                      ((solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                        *)this,x_00,*pprVar5,local_54,local_7c,selected,theta_local,
                       objective_amplifier_local);
    local_101 = true;
    if ((local_39 & 1U) == 0) {
      local_101 = bVar4;
    }
    local_39 = local_101;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&last_local);
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-01.cpp"
                     ,"224");
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < r_size; ++i)
                logger::log("({} {}) ", R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }